

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cqm.cpp
# Opt level: O2

bool ReadCQM(MemFile *file,shared_ptr<Disk> *disk)

{
  pointer *ppuVar1;
  byte bVar2;
  element_type *peVar3;
  uint16_t uVar4;
  char extraout_AL;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  ssize_t sVar10;
  Data *pDVar11;
  mapped_type *pmVar12;
  exception *peVar13;
  size_t in_RCX;
  long lVar14;
  uint8_t *__nbytes;
  char cVar15;
  byte *pbVar16;
  DataRate DVar17;
  FILE *__stream;
  pointer puVar18;
  undefined8 *in_FS_OFFSET;
  _Put_time<char> __f;
  Data data;
  uint16_t ulen;
  uint local_318;
  uint local_314;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  undefined8 uStack_300;
  long local_2f8;
  char *pcStack_2f0;
  string label;
  string desc;
  CQM_HEADER dh;
  allocator<char> local_218 [32];
  Data block;
  undefined1 uStack_1e0;
  undefined1 uStack_1df;
  undefined1 uStack_1de;
  Format local_6c;
  
  __stream = (FILE *)0x0;
  memset(&dh,0,0x85);
  MemFile::rewind(file,__stream);
  if (extraout_AL == '\0') {
    return false;
  }
  sVar10 = MemFile::read(file,(int)&dh,(void *)0x85,in_RCX);
  if ((char)sVar10 == '\0') {
    return false;
  }
  iVar6 = bcmp(&dh,"CQ\x14",3);
  cVar15 = '\0';
  if (iVar6 != 0) {
    return false;
  }
  pDVar11 = MemFile::data(file);
  puVar18 = (pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  pDVar11 = MemFile::data(file);
  for (; puVar18 !=
         (pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x85; puVar18 = puVar18 + 1) {
    cVar15 = cVar15 + *puVar18;
  }
  if (cVar15 != '\0') {
    peVar13 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[20]>(peVar13,(char (*) [20])"bad header checksum");
    __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_6c.size = 2;
  local_6c.offset = 0;
  local_6c.head0 = 0;
  local_6c.head1 = 1;
  local_6c.gap3 = 0;
  local_6c.cyls_first = false;
  local_6c.fdc = PC;
  DVar17 = _250K;
  if (dh.density == '\x01') {
    DVar17 = _500K;
  }
  local_6c.datarate = _1M;
  if (dh.density != '\x02') {
    local_6c.datarate = DVar17;
  }
  local_6c.interleave = (uint)dh.interleave + (uint)(dh.interleave == '\0') & 0xff;
  local_6c.skew = (int)dh.skew;
  local_6c.base = (int)(byte)(dh.sector_base + 1);
  local_6c.fill = 0xe5;
  if (dh.read_mode != '\0') {
    local_6c.fill = '\0';
  }
  local_6c.cyls = (int)dh.cyls;
  local_6c.heads = (int)(ushort)dh.heads;
  local_6c.sectors = (int)(ushort)dh.sec_per_track;
  local_6c.encoding = local_6c.fdc;
  local_6c.size = SizeToCode((uint)(ushort)dh.sector_size);
  Format::Validate(&local_6c);
  if ((ulong)(ushort)dh.comment_len != 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&label,(ulong)(ushort)dh.comment_len,
               (allocator_type *)&block);
    bVar5 = MemFile::read<std::vector<char,std::allocator<char>>>
                      (file,(vector<char,_std::allocator<char>_> *)&label);
    if (!bVar5) {
      peVar13 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[27]>
                (peVar13,(char (*) [27])"short file reading comment");
      __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    _ulen = (pointer)&local_310;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&ulen,label._M_dataplus._M_p,label._M_string_length);
    util::trim((string *)&block,(string *)&ulen);
    peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&desc,"comment",local_218);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar3->metadata,&desc);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&block);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&block);
    std::__cxx11::string::~string((string *)&ulen);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&label);
  }
  if (dh.unknown[0] == '\0' && dh.unknown[1] == '\0') {
    iVar6 = 0;
    for (lVar14 = -0xd; lVar14 != 0; lVar14 = lVar14 + 1) {
      iVar6 = iVar6 + (uint)dh.unknown2[lVar14 + 0xd];
    }
    if (iVar6 == 0) goto LAB_001872fa;
  }
  Message<>(msgWarning,"unused header fields contain non-zero values");
LAB_001872fa:
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = Format::disk_size(&local_6c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)iVar6);
  iVar6 = Format::track_size(&local_6c);
  __nbytes = &local_6c.fill;
  iVar6 = iVar6 * (uint)dh.used_cyls * local_6c.heads;
  while( true ) {
    if (iVar6 <= (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) break;
    sVar10 = MemFile::read(file,(int)&ulen,(void *)0x2,(size_t)__nbytes);
    if ((char)sVar10 == '\0') {
      peVar13 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[29]>
                (peVar13,(char (*) [29])"short file reading disk data");
      __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = ulen;
    if ((long)(short)ulen < 1) {
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      MemFile::read(file,(int)&block,(void *)0x1,(size_t)__nbytes);
      __nbytes = (uint8_t *)&block;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 (const_iterator)
                 data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(uint)-(int)(short)uVar4,
                 (value_type *)&block);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 (long)(short)ulen,(allocator_type *)&desc);
      MemFile::read<Data>(file,&block);
      __nbytes = block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                 (const_iterator)
                 data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
    }
  }
  uVar7 = util::le_value<4,_nullptr>(&dh.data_crc);
  pbVar16 = data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar6 = (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
  if ((crc32(unsigned_char_const*,int,unsigned_int)::crc_table == '\0') &&
     (iVar8 = __cxa_guard_acquire(&crc32(unsigned_char_const*,int,unsigned_int)::crc_table),
     iVar8 != 0)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &crc32(unsigned_char_const*,int,unsigned_int)::crc_table,0x40,
               (allocator_type *)&block);
    __cxa_atexit(std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector,
                 &crc32(unsigned_char_const*,int,unsigned_int)::crc_table,&__dso_handle);
    __cxa_guard_release(&crc32(unsigned_char_const*,int,unsigned_int)::crc_table);
  }
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&ulen;
  *in_FS_OFFSET = &block;
  *in_FS_OFFSET =
       std::once_flag::_Prepare_execution::
       _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
       ::anon_class_1_0_00000001::__invoke;
  iVar8 = pthread_once(&crc32(unsigned_char_const*,int,unsigned_int)::flag,__once_proxy);
  if (iVar8 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    uVar9 = 0;
    for (iVar6 = iVar6 - (int)pbVar16; 0 < iVar6; iVar6 = iVar6 + -1) {
      bVar2 = *pbVar16;
      pbVar16 = pbVar16 + 1;
      uVar9 = uVar9 >> 8 ^
              *(uint *)(crc32(unsigned_char_const*,int,unsigned_int)::crc_table +
                       (ulong)((bVar2 ^ uVar9) & 0x3f) * 4);
    }
    if (uVar9 == uVar7) {
      bVar5 = MemFile::eof(file);
      if (!bVar5) {
        Message<>(msgWarning,"extra data found at end of file");
      }
      ppuVar1 = &block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&block,dh.description,&dh.read_mode)
      ;
      util::trim(&desc,(string *)&block);
      std::__cxx11::string::~string((string *)&block);
      if (desc._M_string_length != 0) {
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&block,"description",(allocator<char> *)&ulen);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)&block);
        std::__cxx11::string::_M_assign((string *)pmVar12);
        std::__cxx11::string::~string((string *)&block);
      }
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = dh.vol_label[7];
      uStack_1e0 = dh.vol_label[8];
      uStack_1df = dh.vol_label[9];
      uStack_1de = dh.vol_label[10];
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xb;
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
      util::trim(&label,(string *)&block);
      std::__cxx11::string::~string((string *)&block);
      if ((label._M_string_length != 0) && (bVar5 = std::operator!=(&label,"** NONE **"), bVar5)) {
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&block,"label",(allocator<char> *)&ulen);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)&block);
        std::__cxx11::string::_M_assign((string *)pmVar12);
        std::__cxx11::string::~string((string *)&block);
      }
      if (dh.cyls != dh.used_cyls) {
        std::__cxx11::to_string((string *)&block,(uint)dh.used_cyls);
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string<std::allocator<char>>((string *)&ulen,"used_cyls",local_218);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)&ulen);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&block);
        std::__cxx11::string::~string((string *)&ulen);
        std::__cxx11::string::~string((string *)&block);
      }
      if (dh.read_mode < 3) {
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&block,"read_mode",(allocator<char> *)&ulen);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)&block);
        std::__cxx11::string::assign((char *)pmVar12);
        std::__cxx11::string::~string((string *)&block);
      }
      if ((byte)(dh.drv_type - 1) < 6) {
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&block,"drive",(allocator<char> *)&ulen);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)&block);
        std::__cxx11::string::assign((char *)pmVar12);
        std::__cxx11::string::~string((string *)&block);
      }
      local_310._8_8_ = 0;
      local_2f8 = 0;
      pcStack_2f0 = (char *)0x0;
      local_310._M_allocated_capacity._4_4_ = ((ushort)dh.dos_date >> 9) + 0x50;
      local_310._M_allocated_capacity._0_4_ = ((ushort)dh.dos_date >> 5 & 0xf) - 1;
      local_314 = (ushort)dh.dos_date & 0x1f;
      local_318 = (uint)((ushort)dh.dos_time >> 0xb);
      _ulen = (pointer)((ulong)CONCAT24((ushort)dh.dos_time >> 5,(uint)(ushort)dh.dos_time * 2) &
                       0x3f0000003e);
      uStack_300._0_4_ = -1;
      uStack_300._4_4_ = 0;
      std::__cxx11::stringstream::stringstream((stringstream *)&block);
      __f._M_fmt = "%Y-%m-%d %T";
      __f._M_tmb = (tm *)&ulen;
      std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                      &block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,__f);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&block);
      peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&block,"created",(allocator<char> *)&ulen);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar3->metadata,(key_type *)&block);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)local_218);
      std::__cxx11::string::~string((string *)&block);
      std::__cxx11::string::~string((string *)local_218);
      iVar6 = Format::disk_size(&local_6c);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)iVar6,
                 &local_6c.fill);
      Disk::format((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,&local_6c,
                   &data,false);
      std::__cxx11::string::assign
                ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          strType);
      std::__cxx11::string::~string((string *)&label);
      std::__cxx11::string::~string((string *)&desc);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      return true;
    }
    peVar13 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[17]>(peVar13,(char (*) [17])"invalid data crc");
    __cxa_throw(peVar13,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__throw_system_error(iVar8);
}

Assistant:

bool ReadCQM(MemFile& file, std::shared_ptr<Disk>& disk)
{
    CQM_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;

    if (memcmp(&dh.sig, CQM_SIGNATURE, sizeof(dh.sig)))
        return false;

    auto header_checksum = std::accumulate(
        file.data().begin(), file.data().begin() + sizeof(dh), 0);
    if (header_checksum & 0xff)
        throw util::exception("bad header checksum");

    Format fmt;
    fmt.fdc = FdcType::PC;
    fmt.encoding = Encoding::MFM;
    fmt.datarate = (dh.density == 2) ? DataRate::_1M :
        (dh.density == 1) ? DataRate::_500K : DataRate::_250K;
    fmt.interleave = (dh.interleave <= 1) ? 1 : dh.interleave;
    fmt.skew = dh.skew;
    fmt.base = (dh.sector_base + 1) & 0xff;
    fmt.fill = (dh.read_mode == 0) ? 0xe5 : 0x00;
    fmt.cyls = dh.cyls;
    fmt.heads = util::le_value(dh.heads);
    fmt.sectors = util::le_value(dh.sec_per_track);
    fmt.size = SizeToCode(util::le_value(dh.sector_size));
    fmt.Validate();

    int comment_len = util::le_value(dh.comment_len);
    if (comment_len)
    {
        std::vector<char> comment(comment_len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        disk->metadata["comment"] = util::trim(std::string(comment.data(), comment.size()));
    }

    if (std::accumulate(std::begin(dh.unknown), std::end(dh.unknown), 0) ||
        std::accumulate(std::begin(dh.unknown2), std::end(dh.unknown2), 0))
    {
        Message(msgWarning, "unused header fields contain non-zero values");
    }

    Data data;
    data.reserve(fmt.disk_size());

    auto data_size = fmt.track_size() * dh.used_cyls * fmt.heads;
    while (data.size() < data_size)
    {
        uint16_t ulen;
        if (!file.read(&ulen, sizeof(ulen)))
            throw util::exception("short file reading disk data");

        auto len = static_cast<int16_t>(util::letoh(ulen));
        if (len <= 0)
        {
            uint8_t fill = 0;
            file.read(&fill, sizeof(fill));
            data.insert(data.end(), -len, fill);
        }
        else
        {
            Data block(len);
            file.read(block);
            data.insert(data.end(), block.begin(), block.end());
        }
    }

    auto data_crc = util::le_value(dh.data_crc);
    auto calc_data_crc = crc32(data.data(), data.size());
    if (calc_data_crc != data_crc)
        throw util::exception("invalid data crc");

    if (!file.eof())
        Message(msgWarning, "extra data found at end of file");

    auto desc = util::trim(std::string(dh.description, sizeof(dh.description)));
    if (!desc.empty())
        disk->metadata["description"] = desc;

    auto label = util::trim(std::string(dh.vol_label, sizeof(dh.vol_label)));
    if (!label.empty() && label != "** NONE **")
        disk->metadata["label"] = label;

    if (dh.cyls != dh.used_cyls)
        disk->metadata["used_cyls"] = std::to_string(dh.used_cyls);

    static const char* read_modes[] = { "DOS", "blind", "HFS" };
    if (dh.read_mode < 3)
        disk->metadata["read_mode"] = read_modes[dh.read_mode];

    static const char* drv_types[] = {
        "5.25\" 360KB", "5.25\" 1.2MB", "3.5\" 720KB", "3.5\" 1.44MB", "8\"", "3.5\" 2.88MB" };
    if (dh.drv_type >= 1 && dh.drv_type <= 6)
        disk->metadata["drive"] = drv_types[dh.drv_type - 1];

    auto dos_date = util::le_value(dh.dos_date);
    auto dos_time = util::le_value(dh.dos_time);
    disk->metadata["created"] = FormatTime(dos_date, dos_time);

    data.resize(fmt.disk_size(), fmt.fill);
    disk->format(fmt, data);
    disk->strType = "CQM";

    return true;
}